

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall mat_lib::matrix<double>::matrix(matrix<double> *this,list *mat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  element_t *peVar5;
  logic_error *this_00;
  ulong uVar6;
  int iVar7;
  result_type rVar8;
  proxy<boost::python::api::item_policies> local_88;
  PyObject *local_78;
  size_t local_70;
  size_t local_68;
  proxy<boost::python::api::item_policies> local_60;
  extract_rvalue<double> local_50;
  
  (this->super_base_matrix<double>).format__ = fixed;
  (this->super_base_matrix<double>).fractional_digits__ = 6;
  sVar4 = boost::python::len((object *)mat);
  iVar1 = (int)sVar4;
  if (iVar1 == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"can\'t create empty arrays");
  }
  else {
    local_60.m_target.super_object_base.m_ptr._0_4_ = 0;
    boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
              ((object_operators<boost::python::api::object> *)&local_50,(int *)mat);
    boost::python::api::proxy::operator_cast_to_object((proxy *)&local_88);
    sVar4 = boost::python::len(&local_88.m_target);
    boost::python::api::object_base::~object_base((object_base *)&local_88);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy
              ((proxy<boost::python::api::item_policies> *)&local_50);
    this->rows__ = (long)iVar1;
    iVar7 = (int)sVar4;
    this->columns__ = (long)iVar7;
    uVar6 = (long)iVar7 * (long)iVar1;
    peVar5 = (element_t *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
    this->elements__ = peVar5;
    iVar3 = 0;
    while( true ) {
      if (iVar1 <= iVar3) {
        return;
      }
      local_68 = this->columns__;
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)&local_50,(int *)mat);
      boost::python::api::proxy::operator_cast_to_object((proxy *)&local_88);
      local_70 = boost::python::len(&local_88.m_target);
      boost::python::api::object_base::~object_base((object_base *)&local_88);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)&local_50);
      if (local_68 != local_70) break;
      for (iVar2 = 0; iVar2 < iVar7; iVar2 = iVar2 + 1) {
        boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                  ((object_operators<boost::python::api::object> *)&local_60,(int *)mat);
        boost::python::api::
        object_operators<boost::python::api::proxy<boost::python::api::item_policies>_>::
        operator[]<int>((object_operators<boost::python::api::proxy<boost::python::api::item_policies>_>
                         *)&local_88,(int *)&local_60);
        boost::python::api::proxy::operator_cast_to_object((proxy *)&local_78);
        boost::python::converter::extract_rvalue<double>::extract_rvalue(&local_50,local_78);
        rVar8 = boost::python::converter::extract_rvalue<double>::operator()(&local_50);
        this->elements__[(long)iVar3 * this->columns__ + (long)iVar2] = rVar8;
        boost::python::api::object_base::~object_base((object_base *)&local_78);
        boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_88);
        boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_60);
      }
      iVar3 = iVar3 + 1;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"the array must have the same number of columns");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

matrix(boost::python::list mat){
          int len_row = boost::python::len(mat);
          if (len_row == 0)
              throw logic_error("can't create empty arrays");
          int len_col = boost::python::len(mat[0]);

          rows__ = len_row;
          columns__ = len_col;
          elements__ = new element_t[rows__ * columns__];

          for (int i = 0; i < len_row; i++) {

              if (columns__ != boost::python::len(mat[i]))
                  throw logic_error("the array must have the same number of columns");

              for (int j = 0; j < len_col; j++) {
                  elements__[offset__(i,j)] = boost::python::extract<element_t>(mat[i][j]);
              }
          }

      }